

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usda::USDAReader::Impl::RegisterReconstructCallback<tinyusdz::DomeLight>(Impl *this)

{
  anon_class_8_1_8991fb9c local_60;
  PrimConstructFunction local_58;
  allocator local_31;
  string local_30;
  Impl *local_10;
  Impl *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_30,"DomeLight",&local_31);
  local_60.this = this;
  ::std::
  function<nonstd::expected_lite::expected<bool,std::__cxx11::string>(tinyusdz::Path_const&,tinyusdz::Specifier,std::__cxx11::string_const&,tinyusdz::Path_const&,long,long,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::map<std::__cxx11::string,std::pair<tinyusdz::ListEditQual,tinyusdz::MetaVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<tinyusdz::ListEditQual,tinyusdz::MetaVariable>>>>const&,std::map<std::__cxx11::string,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>const&)>
  ::
  function<tinyusdz::usda::USDAReader::Impl::RegisterReconstructCallback<tinyusdz::DomeLight>()::_lambda(tinyusdz::Path_const&,tinyusdz::Specifier,std::__cxx11::string_const&,tinyusdz::Path_const&,long,long,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::map<std::__cxx11::string,std::pair<tinyusdz::ListEditQual,tinyusdz::MetaVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<tinyusdz::ListEditQual,tinyusdz::MetaVariable>>>>const&,std::map<std::__cxx11::string,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>const&)_1_,void>
            ((function<nonstd::expected_lite::expected<bool,std::__cxx11::string>(tinyusdz::Path_const&,tinyusdz::Specifier,std::__cxx11::string_const&,tinyusdz::Path_const&,long,long,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::map<std::__cxx11::string,std::pair<tinyusdz::ListEditQual,tinyusdz::MetaVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<tinyusdz::ListEditQual,tinyusdz::MetaVariable>>>>const&,std::map<std::__cxx11::string,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>const&)>
              *)&local_58,&local_60);
  ascii::AsciiParser::RegisterPrimConstructFunction(&this->_parser,&local_30,&local_58);
  ::std::function<$3792144$>::~function(&local_58);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return true;
}

Assistant:

bool RegisterReconstructCallback() {
    _parser.RegisterPrimConstructFunction(
        PrimTypeTraits<T>::prim_type_name,
        [&](const Path &full_path, const Specifier spec, const std::string &_primTypeName, const Path &prim_name, const int64_t primIdx,
            const int64_t parentPrimIdx,
            const prim::PropertyMap &properties,
            const ascii::AsciiParser::PrimMetaMap &in_meta,
            const ascii::AsciiParser::VariantSetList &in_variants)
            -> nonstd::expected<bool, std::string> {

          std::string primTypeName = _primTypeName;
          if (primTypeName == "__AnyType__") {
            primTypeName = ""; // Make empty
          }

          if (!prim_name.is_valid()) {
            return nonstd::make_unexpected("Invalid Prim name: " +
                                           prim_name.full_path_name());
          }
          if (prim_name.is_absolute_path() || prim_name.is_root_path()) {
            return nonstd::make_unexpected(
                "Prim name should not starts with '/' or contain `/`: Prim "
                "name = " +
                prim_name.full_path_name());
          }

          if (!prim_name.prop_part().empty()) {
            return nonstd::make_unexpected(
                "Prim path should not contain property part(`.`): Prim name "
                "= " +
                prim_name.full_path_name());
          }

          if (primIdx < 0) {
            return nonstd::make_unexpected(
                "Unexpected primIdx value. primIdx must be positive.");
          }

          T prim;

          if (!ReconstructPrimMeta(in_meta, &prim.meta)) {
            return nonstd::make_unexpected(
                "Failed to process Prim metadataum.");
          }

          DCOUT("primType = " << value::TypeTraits<T>::type_name()
                              << ", node.size "
                              << std::to_string(_prim_nodes.size())
                              << ", primIdx = " << primIdx
                              << ", parentPrimIdx = " << parentPrimIdx);

          DCOUT("full_path = " << full_path.full_path_name());
          DCOUT("primName = " << prim_name.full_path_name());

          prim::ReferenceList references;
          if (prim.meta.references) {
            references = prim.meta.references.value();
          }

          bool ret = ReconstructPrim<T>(spec, properties, references, &prim);

          if (!ret) {
            return nonstd::make_unexpected("Failed to reconstruct Prim: " +
                                           prim_name.full_path_name());
          }

          prim.spec = spec;
          prim.name = prim_name.prim_part();

          //
          // variants
          // NOTE: variantChildren setup is delayed. It will be processed in ConstructPrimSpecTreeRec
          //
          std::map<std::string, std::map<std::string, VariantNode>> variantSets;
          for (const auto &variantContext : in_variants) {
            const std::string variant_name = variantContext.first;

            // Convert VariantContent -> VariantNode
            std::map<std::string, VariantNode> variantNodes;
            for (const auto &item : variantContext.second) {
              VariantNode variant;
              if (!ReconstructPrimMeta(item.second.metas, &variant.metas)) {
                return nonstd::make_unexpected(fmt::format("Failed to process Prim metadataum in variantSet {} item {} ", variant_name, item.first));
              }
              variant.props = item.second.props;

              // child Prim should be already reconstructed.
              for (const auto &childPrimIdx : item.second.primIndices) {
                if (childPrimIdx < 0) {
                  return nonstd::make_unexpected(fmt::format("[InternalError] Invalid primIndex found within VariantSet."));
                }

                if (size_t(childPrimIdx) >= _prim_nodes.size()) {
                  return nonstd::make_unexpected(fmt::format("[InternalError] Invalid primIndex found within VariantSet. variantChildPrimIdsx {} Exceeds _prim_nodes.size() {}", childPrimIdx, _prim_nodes.size()));
                }

                variant.primChildren.push_back(childPrimIdx);

                //_prim_nodes[size_t(childPrimIdx)].parent_is_variant = true;
              }
              DCOUT("Add variant: " << item.first);
              variantNodes.emplace(item.first, std::move(variant));
            }

            DCOUT("Add variantSet: " << variant_name);
            variantSets.emplace(variant_name, std::move(variantNodes));
          }

          // Add to scene graph.
          // NOTE: Scene graph is constructed from bottom up manner(Children
          // first), so add this primIdx to parent's children.
          if (size_t(primIdx) >= _prim_nodes.size()) {
            _prim_nodes.resize(size_t(primIdx) + 1);
          }
          DCOUT("sz " << std::to_string(_prim_nodes.size())
                      << ", primIdx = " << primIdx);

          _prim_nodes[size_t(primIdx)].prim = std::move(prim);
          _prim_nodes[size_t(primIdx)].typeName = primTypeName;
          _prim_nodes[size_t(primIdx)].variantNodeMap = variantSets;


          // Store actual Prim typeName also for Model Prim type.
          // TODO: Find more better way.
          {
            value::Value *p = &(_prim_nodes[size_t(primIdx)].prim);
            Model *model = p->as<Model>();
            if (model) {
              DCOUT("Set prim typeName " << primTypeName << " to Model Prim[" << primIdx << "]");
              model->prim_type_name = primTypeName;
            }
          }

          DCOUT("prim[" << primIdx << "].ty = "
                        << _prim_nodes[size_t(primIdx)].prim.type_name());
          _prim_nodes[size_t(primIdx)].parent = parentPrimIdx;

          if (parentPrimIdx == -1) {
            _toplevel_prims.push_back(size_t(primIdx));
          } else {
            _prim_nodes[size_t(parentPrimIdx)].children.push_back(
                  size_t(primIdx));
          }

          return true;
        });

    return true;
  }